

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  LocationRecorder *in_RCX;
  ServiceDescriptorProto *in_RDX;
  Parser *in_RSI;
  Message *in_RDI;
  char *in_stack_00000010;
  Parser *in_stack_00000018;
  LocationRecorder location;
  int in_stack_ffffffffffffff94;
  LocationRecorder *in_stack_ffffffffffffff98;
  LocationRecorder *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  FileDescriptorProto *in_stack_ffffffffffffffd0;
  byte local_1;
  
  bVar1 = Consume(in_stack_00000018,in_stack_00000010);
  if (bVar1) {
    this_00 = (LocationRecorder *)&stack0xffffffffffffffc0;
    LocationRecorder::LocationRecorder(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_RDI,(ErrorLocation)((ulong)this_00 >> 0x20));
    ServiceDescriptorProto::mutable_name_abi_cxx11_((ServiceDescriptorProto *)0x609a46);
    bVar1 = ConsumeIdentifier(in_RSI,(string *)in_RDX,(char *)in_RCX);
    if (!bVar1) {
      local_1 = 0;
    }
    uVar2 = (uint)!bVar1;
    LocationRecorder::~LocationRecorder(this_00);
    if (uVar2 == 0) {
      bVar1 = ParseServiceBlock(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
      if (bVar1) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service, const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(service,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}